

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimum.cpp
# Opt level: O2

bool __thiscall Minimum<1>::propagate(Minimum<1> *this)

{
  uint uVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Clause *pCVar7;
  Lit *pLVar8;
  IntVar *pIVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  int i;
  long lVar13;
  long lVar14;
  
  pIVar9 = (this->y).var;
  lVar10 = (this->min_max).v;
  lVar6 = (long)(pIVar9->min).v;
  if (SBORROW8(lVar10,-lVar6) == lVar10 + lVar6 < 0) {
LAB_00142f7a:
    if (this->lower_change == true) {
      uVar1 = this->sz;
      lVar10 = 0;
      uVar11 = 0;
      if (0 < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      lVar6 = 0x7fffffffffffffff;
      for (; uVar11 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        lVar13 = (long)*(int *)(*(long *)((long)&this->x->var + lVar10) + 0x10);
        lVar14 = -lVar13;
        if (SBORROW8(lVar6,lVar14) == lVar6 + lVar13 < 0) {
          lVar6 = lVar14;
        }
      }
      pIVar9 = (this->y).var;
      iVar4 = (pIVar9->max).v;
      lVar10 = -(long)iVar4;
      if (lVar6 != lVar10 && SBORROW8(lVar6,lVar10) == lVar6 + iVar4 < 0) {
        if (so.lazy == false) {
          pCVar7 = (Clause *)0x0;
        }
        else {
          pCVar7 = Reason_new(uVar1 + 1);
          lVar13 = 0;
          lVar10 = 0;
          while (lVar10 < this->sz) {
            plVar2 = *(long **)((long)&this->x->var + lVar13);
            iVar4 = (**(code **)(*plVar2 + 0x60))(plVar2,-lVar6);
            lVar10 = lVar10 + 1;
            pLVar8 = Clause::operator[](pCVar7,(int)lVar10);
            pLVar8->x = iVar4;
            lVar13 = lVar13 + 0x10;
          }
          pIVar9 = (this->y).var;
        }
        iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])(pIVar9,-lVar6,pCVar7,1);
        if ((char)iVar4 == '\0') goto LAB_001430ed;
        iVar4 = (((this->y).var)->max).v;
      }
      if (so.lazy == true) {
        pCVar7 = Reason_new(2);
        iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        pLVar8 = Clause::operator[](pCVar7,1);
        pLVar8->x = iVar5;
      }
      else {
        pCVar7 = (Clause *)0x0;
      }
      lVar6 = 0;
      for (lVar10 = 0; lVar10 < this->sz; lVar10 = lVar10 + 1) {
        plVar2 = *(long **)((long)&this->x->var + lVar6);
        if (iVar4 < (int)plVar2[2]) {
          cVar3 = (**(code **)(*plVar2 + 0x78))(plVar2,(long)iVar4,pCVar7,1);
          if (cVar3 == '\0') goto LAB_001430ed;
        }
        lVar6 = lVar6 + 0x10;
      }
    }
    bVar12 = true;
    if ((long)(((this->y).var)->max).v + (this->min_max).v == 0) {
      Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
    }
  }
  else {
    if (so.lazy) {
      iVar4 = (*((this->x[(this->min_max_var).v].var)->super_Var).super_Branching._vptr_Branching[8]
              )();
      lVar6 = (long)iVar4 * 4 + 2;
      pIVar9 = (this->y).var;
    }
    else {
      lVar6 = 0;
    }
    iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])(pIVar9,-lVar10,lVar6);
    if ((char)iVar4 != '\0') goto LAB_00142f7a;
LAB_001430ed:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(x_i))
		setDom(y, setMax, min_max, x[min_max_var].getMaxLit());

		if (lower_change) {
			// make a greater than or equal to min(min(b_i))
			int64_t m = INT64_MAX;
			for (int i = 0; i < sz; i++) {
				const int64_t t = x[i].getMin();
				if (t < m) {
					m = t;
				}
			}
			if (y.setMinNotR(m)) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(sz + 1);
					// Finesse lower bounds
					// Add reason ![y <= m-1] \/ [x_1 <= m-1] \/ ... \/ [x_n <= m-1]
					for (int i = 0; i < sz; i++) {
						(*r)[i + 1] = x[i].getFMinLit(m);
					}
					//					for (int i = 0; i < sz; i++) (*r)[i+1] = x[i].getLit(m-1, LR_LE);
				}
				if (!y.setMin(m, r)) {
					return false;
				}
			}

			// make b_i greater than or equal to min(a)
			m = y.getMin();
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = y.getMinLit();
			}
			for (int i = 0; i < sz; i++) {
				if (x[i].setMinNotR(m)) {
					if (!x[i].setMin(m, r)) {
						return false;
					}
				}
			}
		}

		// Necessary and sufficient conditions for redundancy

		if (y.getMin() == min_max) {
			satisfied = true;
		}

		return true;
	}